

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O1

void __thiscall Path::arc_to(Path *this,Point r,float rotation,bool large_arc,bool sweep,Point *end)

{
  pointer pSVar1;
  pointer pPVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar8;
  Point PVar7;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Transformation t;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float local_c8;
  float fStack_c4;
  Point local_98;
  Point local_40;
  Transformation local_38;
  
  fVar4 = r.x;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar8 = r.y;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      pSVar1 = (this->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((this->subpaths).super__Vector_base<Subpath,_std::allocator<Subpath>_>._M_impl.
          super__Vector_impl_data._M_start == pSVar1) {
        PVar7.x = 0.0;
        PVar7.y = 0.0;
      }
      else {
        if (pSVar1[-1].closed == true) {
          pPVar2 = pSVar1[-1].points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          pPVar2 = pSVar1[-1].points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
        }
        PVar7 = *pPVar2;
      }
      local_d8 = -rotation;
      fVar5 = cosf(-rotation);
      fVar6 = sinf(local_d8);
      local_c8 = PVar7.x;
      fStack_c4 = PVar7.y;
      fVar12 = (local_c8 - end->x) * 0.5;
      fVar9 = (fStack_c4 - end->y) * 0.5;
      fVar11 = (fVar5 * fVar12 - fVar9 * fVar6) + 0.0;
      fVar12 = fVar12 * fVar6 + fVar9 * fVar5 + 0.0;
      fVar5 = fVar4 * fVar4 * fVar12 * fVar12;
      fVar6 = fVar8 * fVar4 * fVar4 * fVar8;
      fVar9 = fVar8 * fVar8 * fVar11 * fVar11;
      fStack_e4 = (fVar6 - fVar5) - fVar9;
      if (0.0 <= fStack_e4) {
        fStack_e4 = fStack_e4 / (fVar5 + fVar9);
        if (fStack_e4 < 0.0) {
          fStack_e4 = sqrtf(fStack_e4);
        }
        else {
          fStack_e4 = SQRT(fStack_e4);
        }
        local_e8 = ((fVar4 * fVar12) / fVar8) * fStack_e4;
        fStack_e4 = ((-fVar8 * fVar11) / fVar4) * fStack_e4;
        local_98 = r;
        if (large_arc == sweep) {
          local_e8 = -local_e8;
          fStack_e4 = -fStack_e4;
        }
      }
      else {
        fVar5 = 1.0 - fStack_e4 / fVar6;
        if (fVar5 < 0.0) {
          fVar5 = sqrtf(fVar5);
        }
        else {
          fVar5 = SQRT(fVar5);
        }
        local_98.y = fVar8 * fVar5;
        local_98.x = fVar4 * fVar5;
        local_e8 = 0.0;
        fStack_e4 = 0.0;
      }
      fVar5 = cosf(rotation);
      fVar6 = sinf(rotation);
      fVar4 = end->x;
      fVar8 = end->y;
      fVar13 = (1.0 / local_98.x) * (fVar11 - local_e8) + (fVar12 - fStack_e4) * 0.0 + 0.0;
      fVar15 = (fVar11 - local_e8) * 0.0 + (fVar12 - fStack_e4) * (1.0 / local_98.y);
      fVar9 = fVar15 + 0.0;
      fVar9 = fVar13 * fVar13 + fVar9 * fVar9;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      fVar9 = acosf(fVar13 / fVar9);
      uVar3 = -(uint)(fVar15 < 0.0);
      fVar9 = (float)((uint)-fVar9 & uVar3 | ~uVar3 & (uint)fVar9);
      fVar13 = (1.0 / local_98.x) * (-fVar11 - local_e8) + (-fVar12 - fStack_e4) * 0.0 + 0.0;
      fVar12 = (-fVar11 - local_e8) * 0.0 + (-fVar12 - fStack_e4) * (1.0 / local_98.y);
      fVar11 = fVar12 + 0.0;
      fVar11 = fVar13 * fVar13 + fVar11 * fVar11;
      if (fVar11 < 0.0) {
        fVar11 = sqrtf(fVar11);
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      fVar11 = acosf(fVar13 / fVar11);
      uVar3 = -(uint)(fVar12 < 0.0);
      local_d8 = (float)(uVar3 & (uint)-fVar11 | ~uVar3 & (uint)fVar11) - fVar9;
      if (0.0 < local_d8 && !sweep) {
        local_d8 = local_d8 + -6.2831855;
      }
      else if (sweep && local_d8 < 0.0) {
        local_d8 = local_d8 + 6.2831855;
      }
      fVar11 = cosf(rotation);
      fVar12 = sinf(rotation);
      fVar13 = fVar11 * 0.0 + fVar12;
      fVar15 = fVar11 * 0.0 - fVar12;
      fVar10 = fVar11 + fVar12 * 0.0;
      fVar11 = fVar11 - fVar12 * 0.0;
      fVar12 = fVar15 * 0.0;
      local_38.a = fVar10 * local_98.x + fVar12;
      fVar14 = fVar11 * 0.0;
      local_38.b = local_98.x * fVar13 + fVar14;
      fVar10 = fVar10 * 0.0;
      local_38.c = local_98.y * fVar15 + fVar10;
      fVar13 = fVar13 * 0.0;
      local_38.d = local_98.y * fVar11 + fVar13;
      local_38.e = (fVar5 * local_e8 - fStack_e4 * fVar6) + 0.0 + (fVar4 + local_c8) * 0.5 +
                   fVar10 + fVar12;
      local_38.f = fVar6 * local_e8 + fStack_e4 * fVar5 + 0.0 + (fVar8 + fStack_c4) * 0.5 +
                   fVar13 + fVar14;
      local_40.x = 0.0;
      local_40.y = 0.0;
      add_arc(this,&local_40,1.0,fVar9,local_d8,&local_38);
      return;
    }
  }
  line_to(this,end);
  return;
}

Assistant:

void arc_to(Point r, float rotation, bool large_arc, bool sweep, const Point& end) {
		if (r.x == 0.f || r.y == 0.f) {
			line_to(end);
			return;
		}
		const Point& start = current_point();
		const Point p = Transformation::rotate(-rotation) * ((start - end) * .5f);
		Point c(0.f, 0.f);
		const float numerator = (r.x*r.x * r.y*r.y - r.x*r.x * p.y*p.y - r.y*r.y * p.x*p.x);
		if (numerator < 0.f) {
			r = r * std::sqrt(1.f - numerator / (r.x*r.x * r.y*r.y));
		}
		else {
			const float denominator = (r.x*r.x * p.y*p.y + r.y*r.y * p.x*p.x);
			c = Point(r.x*p.y/r.y, -r.y*p.x/r.x) * std::sqrt(numerator / denominator);
			if (large_arc == sweep) {
				c = c * -1.f;
			}
		}
		const Point center = Transformation::rotate(rotation) * c + (start + end) * .5f;
		const float start_angle = angle(Transformation::scale(1.f / r.x, 1.f / r.y) * (p - c));
		const float end_angle = angle(Transformation::scale(1.f / r.x, 1.f / r.y) * (-p - c));
		float sweep_angle = end_angle - start_angle;
		if (sweep == false && sweep_angle > 0.f) {
			sweep_angle -= 2.f * M_PI;
		}
		else if (sweep == true && sweep_angle < 0.f) {
			sweep_angle += 2.f * M_PI;
		}
		const Transformation t = Transformation::translate(center.x, center.y) * Transformation::rotate(rotation) * Transformation::scale(r.x, r.y);
		add_arc(Point(0.f, 0.f), 1.f, start_angle, sweep_angle, t);
	}